

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O1

void __thiscall
icu_63::StringTrieBuilder::build
          (StringTrieBuilder *this,UStringTrieBuildOption buildOption,int32_t elementsLength,
          UErrorCode *errorCode)

{
  Node *pNVar1;
  
  if (buildOption != USTRINGTRIE_BUILD_FAST) {
    createCompactBuilder(this,elementsLength * 2,errorCode);
    pNVar1 = makeNode(this,0,elementsLength,0,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      (*(pNVar1->super_UObject)._vptr_UObject[4])(pNVar1,0xffffffff);
      (*(pNVar1->super_UObject)._vptr_UObject[5])(pNVar1,this);
    }
    uhash_close_63(this->nodes);
    this->nodes = (UHashtable *)0x0;
    return;
  }
  writeNode(this,0,elementsLength,0);
  return;
}

Assistant:

void
StringTrieBuilder::build(UStringTrieBuildOption buildOption, int32_t elementsLength,
                       UErrorCode &errorCode) {
    if(buildOption==USTRINGTRIE_BUILD_FAST) {
        writeNode(0, elementsLength, 0);
    } else /* USTRINGTRIE_BUILD_SMALL */ {
        createCompactBuilder(2*elementsLength, errorCode);
        Node *root=makeNode(0, elementsLength, 0, errorCode);
        if(U_SUCCESS(errorCode)) {
            root->markRightEdgesFirst(-1);
            root->write(*this);
        }
        deleteCompactBuilder();
    }
}